

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O1

void deserialize_node<std::istream,long,unsigned_long>
               (SingleTreeIndex *node,basic_istream<char,_std::char_traits<char>_> *in,
               vector<char,_std::allocator<char>_> *buffer,bool diff_endian)

{
  size_t vec_size;
  size_t local_30;
  
  if (!interrupt_switch) {
    read_bytes<unsigned_long>(&local_30,1,in);
    if (diff_endian) {
      swap_endianness<unsigned_long>(&local_30,1);
    }
    read_bytes<unsigned_long>(&node->terminal_node_mappings,local_30,in);
    if (diff_endian) {
      deserialize_node<std::istream,long,unsigned_long>();
    }
    else {
      read_bytes<unsigned_long>(&local_30,1,in);
    }
    read_bytes<double>(&node->node_distances,local_30,in);
    if (diff_endian) {
      deserialize_node<std::istream,long,unsigned_long>();
    }
    else {
      read_bytes<unsigned_long>(&local_30,1,in);
    }
    read_bytes<double>(&node->node_depths,local_30,in);
    if (diff_endian) {
      deserialize_node<std::istream,long,unsigned_long>();
    }
    else {
      read_bytes<unsigned_long>(&local_30,1,in);
    }
    read_bytes<unsigned_long>(&node->reference_points,local_30,in);
    if (diff_endian) {
      deserialize_node<std::istream,long,unsigned_long>();
    }
    else {
      read_bytes<unsigned_long>(&local_30,1,in);
    }
    read_bytes<unsigned_long>(&node->reference_indptr,local_30,in);
    if (diff_endian) {
      deserialize_node<std::istream,long,unsigned_long>();
    }
    else {
      read_bytes<unsigned_long>(&local_30,1,in);
    }
    read_bytes<unsigned_long>(&node->reference_mapping,local_30,in);
    if (diff_endian) {
      swap_endianness<unsigned_long>
                ((node->reference_mapping).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start,local_30);
    }
    read_bytes<unsigned_long>(&node->n_terminal,1,in);
    if (diff_endian) {
      swap_endianness<unsigned_long>(&node->n_terminal,1);
    }
  }
  return;
}

Assistant:

void deserialize_node(SingleTreeIndex &node, itype &in, std::vector<char> &buffer, const bool diff_endian)
{
    if (interrupt_switch) return;

    size_t vec_size;
    read_bytes<size_t, saved_size_t>((void*)&vec_size, (size_t)1, in, buffer, diff_endian);
    read_bytes<size_t, saved_size_t>(node.terminal_node_mappings, vec_size, in, buffer, diff_endian);

    read_bytes<size_t, saved_size_t>((void*)&vec_size, (size_t)1, in, buffer, diff_endian);
    read_bytes<double, double>(node.node_distances, vec_size, in, buffer, diff_endian);

    read_bytes<size_t, saved_size_t>((void*)&vec_size, (size_t)1, in, buffer, diff_endian);
    read_bytes<double, double>(node.node_depths, vec_size, in, buffer, diff_endian);

    read_bytes<size_t, saved_size_t>((void*)&vec_size, (size_t)1, in, buffer, diff_endian);
    read_bytes<size_t, saved_size_t>(node.reference_points, vec_size, in, buffer, diff_endian);

    read_bytes<size_t, saved_size_t>((void*)&vec_size, (size_t)1, in, buffer, diff_endian);
    read_bytes<size_t, saved_size_t>(node.reference_indptr, vec_size, in, buffer, diff_endian);

    read_bytes<size_t, saved_size_t>((void*)&vec_size, (size_t)1, in, buffer, diff_endian);
    read_bytes<size_t, saved_size_t>(node.reference_mapping, vec_size, in, buffer, diff_endian);

    read_bytes<size_t, saved_size_t>((void*)&node.n_terminal, (size_t)1, in, buffer, diff_endian);
}